

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  uint uVar1;
  ImGuiTabItem *pIVar2;
  ImVec2 *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *draw_list;
  ImVec2 IVar5;
  ImGuiContext *ctx;
  bool *pbVar6;
  ulong uVar7;
  bool bVar8;
  ImU32 id;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar9;
  size_t sVar10;
  char *pcVar11;
  ImS8 IVar12;
  int iVar13;
  ImGuiTabItem *pIVar14;
  ImGuiDockNode *pIVar15;
  int iVar16;
  ImGuiTabItem *pIVar17;
  ImGuiTabItem *pIVar18;
  int iVar19;
  ImGuiCol idx;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_98;
  int local_80;
  uint local_7c;
  ImGuiWindow *local_78;
  ImVec2 local_70;
  uint local_68;
  int local_64;
  ImVec2 local_60;
  undefined1 local_58 [8];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  ImGuiTabItem *local_48;
  ImVec2 local_40;
  bool *local_38;
  
  pIVar17 = (ImGuiTabItem *)(ulong)(uint)flags;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    uVar9 = 0;
    goto LAB_001bbd7e;
  }
  local_38 = (bool *)0x0;
  uVar21 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar21 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar21 = flags;
  }
  IVar5 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  fVar23 = IVar5.x;
  local_98.Max.y = IVar5.y;
  if (id == 0) {
LAB_001bbaf6:
    pIVar17 = (ImGuiTabItem *)0x0;
  }
  else {
    uVar9 = (ulong)(tab_bar->Tabs).Size;
    bVar22 = 0 < (long)uVar9;
    if (0 < (long)uVar9) {
      pIVar17 = (tab_bar->Tabs).Data;
      bVar22 = true;
      if (pIVar17->ID != id) {
        pIVar14 = pIVar17 + (uVar9 - 1);
        pIVar18 = pIVar17;
        uVar7 = 1;
        do {
          uVar20 = uVar7;
          pIVar17 = pIVar14;
          if (uVar9 == uVar20) break;
          pIVar17 = pIVar18 + 1;
          pIVar2 = pIVar18 + 1;
          pIVar18 = pIVar17;
          uVar7 = uVar20 + 1;
        } while (pIVar2->ID != id);
        bVar22 = uVar20 < uVar9;
      }
    }
    if (!bVar22) goto LAB_001bbaf6;
  }
  pIVar18 = pIVar17;
  uVar24 = extraout_XMM0_Dc;
  uVar25 = extraout_XMM0_Dd;
  local_78 = pIVar4;
  local_48 = (ImGuiTabItem *)label;
  if (pIVar17 == (ImGuiTabItem *)0x0) {
    iVar19 = (tab_bar->Tabs).Size;
    iVar16 = (tab_bar->Tabs).Capacity;
    uVar24 = extraout_XMM0_Dc;
    uVar25 = extraout_XMM0_Dd;
    if (iVar19 == iVar16) {
      iVar19 = iVar19 + 1;
      if (iVar16 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar16 / 2 + iVar16;
      }
      if (iVar19 < iVar13) {
        iVar19 = iVar13;
      }
      uVar24 = extraout_XMM0_Dc;
      uVar25 = extraout_XMM0_Dd;
      if (iVar16 < iVar19) {
        uStack_50 = extraout_XMM0_Dc;
        local_58._0_4_ = IVar5.x;
        local_58._4_4_ = IVar5.y;
        uStack_4c = extraout_XMM0_Dd;
        label = (char *)MemAlloc((long)iVar19 * 0x28);
        pIVar18 = (tab_bar->Tabs).Data;
        if (pIVar18 != (ImGuiTabItem *)0x0) {
          memcpy(label,pIVar18,(long)(tab_bar->Tabs).Size * 0x28);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = (ImGuiTabItem *)label;
        (tab_bar->Tabs).Capacity = iVar19;
        fVar23 = (float)local_58._0_4_;
        local_98.Max.y = (float)local_58._4_4_;
        uVar24 = uStack_50;
        uVar25 = uStack_4c;
      }
    }
    pIVar14 = (tab_bar->Tabs).Data;
    iVar19 = (tab_bar->Tabs).Size;
    pIVar18 = pIVar14 + iVar19;
    pIVar18->ID = 0;
    pIVar18->Flags = 0;
    pIVar18->Window = (ImGuiWindow *)0x0;
    pIVar14[iVar19].LastFrameVisible = -1;
    pIVar14[iVar19].LastFrameSelected = -1;
    pIVar14[iVar19].NameOffset = -1;
    pIVar14[iVar19].Offset = 0.0;
    pIVar14[iVar19].Width = 0.0;
    pIVar14[iVar19].ContentWidth = 0.0;
    iVar19 = (tab_bar->Tabs).Size;
    uVar1 = iVar19 + 1;
    (tab_bar->Tabs).Size = uVar1;
    if (iVar19 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                    ,0x639,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar14 = (tab_bar->Tabs).Data;
    pIVar18 = pIVar14 + ((ulong)uVar1 - 1);
    pIVar18->ID = id;
    pIVar14[(ulong)uVar1 - 1].Width = fVar23;
  }
  pIVar2 = local_48;
  pIVar14 = (tab_bar->Tabs).Data;
  if ((pIVar18 < pIVar14) || (pIVar14 + (tab_bar->Tabs).Size <= pIVar18)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                  ,0x650,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar18 - (int)pIVar14) >> 3) * -0x3333;
  pIVar18->ContentWidth = fVar23;
  iVar19 = tab_bar->PrevFrameVisible;
  local_68 = tab_bar->Flags;
  local_64 = ctx->FrameCount;
  iVar16 = pIVar18->LastFrameVisible;
  pIVar18->LastFrameVisible = local_64;
  pIVar18->Flags = uVar21;
  pIVar18->Window = docked_window;
  local_7c = uVar21;
  if ((local_68 >> 0x14 & 1) == 0) {
    local_58._4_4_ = local_98.Max.y;
    local_58._0_4_ = fVar23;
    uStack_50 = uVar24;
    uStack_4c = uVar25;
    local_80 = iVar16;
    if (docked_window != (ImGuiWindow *)0x0) {
      __assert_fail("tab->Window == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1c42,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    iVar16 = (tab_bar->TabsNames).Buf.Size;
    iVar13 = iVar16 + -1;
    if (iVar16 == 0) {
      iVar13 = 0;
    }
    pIVar18->NameOffset = iVar13;
    sVar10 = strlen((char *)local_48);
    ImGuiTextBuffer::append
              (&tab_bar->TabsNames,(char *)pIVar2,(char *)((long)&pIVar2->ID + sVar10 + 1));
    label = (char *)pIVar2;
    local_98.Max.y = (float)local_58._4_4_;
    iVar16 = local_80;
  }
  else {
    if (docked_window == (ImGuiWindow *)0x0) {
      __assert_fail("tab->Window != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1c3d,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    pIVar18->NameOffset = -1;
  }
  iVar19 = iVar19 + 1;
  iVar16 = iVar16 + 1;
  if (iVar16 < local_64) {
    if ((((tab_bar->Flags & 2U) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((local_64 <= iVar19 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((tab_bar->Flags & 1U) == 0) {
    fVar23 = tab_bar->OffsetNextTab;
    pIVar18->Offset = fVar23;
    tab_bar->OffsetNextTab = pIVar18->Width + (ctx->Style).ItemInnerSpacing.x + fVar23;
  }
  if (((local_7c & 2) != 0) && (tab_bar->SelectedTabId != id)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar9 = CONCAT71((int7)((ulong)label >> 8),1);
  }
  else {
    uVar9 = 0;
    if (((tab_bar->SelectedTabId == 0) && (docked_window == (ImGuiWindow *)0x0)) &&
       (iVar19 < local_64)) {
      if ((tab_bar->Tabs).Size == 1) {
        uVar9 = (ulong)((tab_bar->Flags & 2) == 0);
      }
      else {
        uVar9 = 0;
      }
    }
  }
  if ((iVar16 < local_64) && (pIVar17 == (ImGuiTabItem *)0x0 || local_64 <= iVar19)) {
    PushItemFlag(0x18,true);
LAB_001bbd7e:
    local_98.Max.x = 0.0;
    local_98.Max.y = 0.0;
    local_98.Min.x = 0.0;
    local_98.Min.y = 0.0;
    ItemAdd(&local_98,id,(ImRect *)0x0);
    PopItemFlag();
    return SUB81(uVar9,0);
  }
  local_58 = (undefined1  [8])uVar9;
  if (tab_bar->SelectedTabId == id) {
    pIVar18->LastFrameSelected = ctx->FrameCount;
  }
  fVar28 = (float)(int)(pIVar18->Offset - tab_bar->ScrollingAnim) + (tab_bar->BarRect).Min.x;
  fVar26 = (tab_bar->BarRect).Min.y + 0.0;
  local_40 = (local_78->DC).CursorPos;
  local_98.Max.x = fVar28 + pIVar18->Width;
  local_98.Min.y = fVar26;
  local_98.Min.x = fVar28;
  (local_78->DC).CursorPos = local_98.Min;
  local_98.Max.y = local_98.Max.y + fVar26;
  fVar23 = (tab_bar->BarRect).Min.x;
  bVar22 = true;
  if (fVar23 <= fVar28) {
    pIVar3 = &(tab_bar->BarRect).Max;
    bVar22 = pIVar3->x <= local_98.Max.x && local_98.Max.x != pIVar3->x;
  }
  local_80 = iVar16;
  if (bVar22) {
    local_60.y = fVar26 + -1.0;
    local_60.x = (float)(~-(uint)(fVar23 <= fVar28) & (uint)fVar23 |
                        (uint)fVar28 & -(uint)(fVar23 <= fVar28));
    local_70.x = (tab_bar->BarRect).Max.x;
    local_70.y = local_98.Max.y;
    PushClipRect(&local_60,&local_70,true);
  }
  pIVar4 = local_78;
  IVar5 = (local_78->DC).CursorMaxPos;
  local_60.y = local_98.Max.y - local_98.Min.y;
  local_60.x = local_98.Max.x - local_98.Min.x;
  ItemSize(&local_60,(ctx->Style).FramePadding.y);
  (pIVar4->DC).CursorMaxPos = IVar5;
  bVar8 = ItemAdd(&local_98,id,(ImRect *)0x0);
  pbVar6 = local_38;
  if (!bVar8) {
    if (bVar22) {
      PopClipRect();
    }
    (local_78->DC).CursorPos = local_40;
    return (bool)local_58[0];
  }
  uVar21 = 0x102;
  if (ctx->DragDropActive == true) {
    if ((ctx->DragDropPayload).DataFrameCount == -1) {
      uVar21 = 0x142;
    }
    else {
      iVar19 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType);
      uVar21 = (uint)(iVar19 != 0) << 6 | 0x102;
    }
  }
  bVar8 = ButtonBehavior(&local_98,id,(bool *)&local_60,(bool *)&local_70,uVar21);
  if (bVar8) {
    tab_bar->NextSelectedTabId = id;
  }
  local_60.x._0_1_ = local_60.x._0_1_ | ctx->HoveredId == id;
  if (((docked_window != (ImGuiWindow *)0x0 && local_70.x._0_1_ == '\x01') && (ctx->ActiveId == id))
     && (ctx->ActiveIdIsJustActivated == true)) {
    ctx->ActiveIdWindow = docked_window;
  }
  if (local_70.x._0_1_ == '\0') {
    SetItemAllowOverlap();
  }
  if (docked_window == (ImGuiWindow *)0x0) {
    pIVar15 = (ImGuiDockNode *)0x0;
  }
  else {
    pIVar15 = docked_window->DockNode;
  }
  bVar8 = true;
  if (((pIVar15 != (ImGuiDockNode *)0x0) && (pIVar15->ParentNode == (ImGuiDockNode *)0x0)) &&
     ((pIVar15->LocalFlags & 0x400U) == 0)) {
    bVar8 = (pIVar15->Windows).Size != 1;
  }
  if (((local_70.x._0_1_ == '\x01') && (!bVar8)) && (bVar8 = IsMouseDragging(0,0.0), bVar8)) {
    StartMouseMovingWindow(docked_window);
    goto LAB_001bc2b3;
  }
  if (((local_70.x._0_1_ != '\x01') || (local_80 < local_64)) ||
     (bVar8 = IsMouseDragging(0,-1.0), !bVar8)) goto LAB_001bc2b3;
  bVar8 = ctx->DragDropActive;
  fVar23 = 0.0;
  if ((bVar8 == false) &&
     (uVar21 = tab_bar->Flags, docked_window != (ImGuiWindow *)0x0 || (uVar21 & 1) != 0)) {
    fVar26 = (ctx->IO).MouseDelta.x;
    if (0.0 <= fVar26) {
LAB_001bc0fa:
      if (((fVar26 <= 0.0) || (fVar26 = (ctx->IO).MousePos.x, fVar26 <= local_98.Max.x)) ||
         (fVar23 = fVar26 - local_98.Max.x, (uVar21 & 1) == 0)) goto LAB_001bc137;
      IVar12 = '\x01';
    }
    else {
      fVar28 = (ctx->IO).MousePos.x;
      if (local_98.Min.x <= fVar28) goto LAB_001bc0fa;
      fVar23 = local_98.Min.x - fVar28;
      if ((uVar21 & 1) == 0) goto LAB_001bc137;
      IVar12 = -1;
    }
    if (tab_bar->ReorderRequestTabId != 0) {
      __assert_fail("tab_bar->ReorderRequestTabId == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                    ,0x1b71,
                    "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                   );
    }
    tab_bar->ReorderRequestTabId = pIVar18->ID;
    tab_bar->ReorderRequestDir = IVar12;
  }
LAB_001bc137:
  if ((docked_window != (ImGuiWindow *)0x0) && ((docked_window->Flags & 4) == 0)) {
    if (bVar8 == false) {
      bVar8 = false;
    }
    else {
      bVar8 = (ctx->DragDropPayload).SourceId == id;
    }
    if (!bVar8) {
      fVar26 = ctx->FontSize;
      fVar27 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar26 + fVar26)) * 0.2;
      fVar28 = fVar26 * 4.0;
      if (fVar27 <= fVar26 * 4.0) {
        fVar28 = fVar27;
      }
      fVar30 = (ctx->IO).MousePos.y;
      fVar29 = local_98.Min.y - fVar30;
      fVar30 = fVar30 - local_98.Max.y;
      uVar21 = -(uint)(fVar30 <= fVar29);
      if (((float)(~uVar21 & (uint)fVar30 | (uint)fVar29 & uVar21) <
           fVar26 * 1.5 + (float)(~-(uint)(fVar27 < 0.0) & (uint)fVar28)) &&
         ((fVar23 <= fVar26 * 2.2 ||
          (((-1 < tab_bar->ReorderRequestDir ||
            (iVar19 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar18), iVar19 != 0)) &&
           ((tab_bar->ReorderRequestDir < '\x01' ||
            (iVar19 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar18), iVar19 != (tab_bar->Tabs).Size + -1
            )))))))) goto LAB_001bc2b3;
    }
    DockContextQueueUndockWindow(ctx,docked_window);
    ctx->MovingWindow = docked_window;
    ctx->ActiveId = docked_window->MoveId;
    fVar23 = (docked_window->Pos).y;
    (ctx->ActiveIdClickOffset).x =
         (ctx->ActiveIdClickOffset).x - ((docked_window->Pos).x - local_98.Min.x);
    (ctx->ActiveIdClickOffset).y = (ctx->ActiveIdClickOffset).y - (fVar23 - local_98.Min.y);
  }
LAB_001bc2b3:
  pIVar17 = local_48;
  draw_list = local_78->DrawList;
  idx = 0x22;
  if ((local_70.x._0_1_ == '\0') && (local_60.x._0_1_ == '\0')) {
    if (local_58[0] == '\0') {
      idx = (uint)((local_68 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_68 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&local_98,local_7c,col);
  RenderNavHighlight(&local_98,id,1);
  bVar8 = IsItemHovered(8);
  if ((bVar8) && ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar21 = (uint)tab_bar->Flags >> 1 & 4 | local_7c;
  if (pbVar6 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(local_78,(void *)((ulong)id + 1));
  }
  bVar8 = TabItemLabelAndCloseButton
                    (draw_list,&local_98,uVar21,tab_bar->FramePadding,(char *)pIVar17,id,
                     close_button_id,(bool)local_58[0]);
  if ((pbVar6 != (bool *)0x0) && (bVar8)) {
    *pbVar6 = false;
    if (tab_bar->VisibleTabId == pIVar18->ID) {
      if ((pIVar18->Flags & 1U) == 0) {
        pIVar18->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if ((pIVar18->Flags & 1U) != 0) {
      tab_bar->NextSelectedTabId = pIVar18->ID;
    }
  }
  if (bVar22) {
    PopClipRect();
  }
  (local_78->DC).CursorPos = local_40;
  if (ctx->HoveredId != id) {
    return (bool)local_58[0];
  }
  if (local_70.x._0_1_ != '\0') {
    return (bool)local_58[0];
  }
  if (ctx->HoveredIdNotActiveTimer <= 0.5) {
    return (bool)local_58[0];
  }
  bVar22 = IsItemHovered(0);
  if (!bVar22) {
    return (bool)local_58[0];
  }
  if ((tab_bar->Flags & 0x20) != 0) {
    return (bool)local_58[0];
  }
  if ((pIVar18->Flags & 0x10) != 0) {
    return (bool)local_58[0];
  }
  pcVar11 = FindRenderedTextEnd((char *)pIVar17,(char *)0x0);
  SetTooltip("%.*s",(ulong)(uint)((int)pcVar11 - (int)pIVar17),pIVar17);
  return (bool)local_58[0];
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        IM_ASSERT(tab->Window != NULL);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW))
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);

            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                //float threshold_base = g.IO.ConfigDockingWithShift ? g.FontSize * 0.5f : g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                else if (drag_distance_from_edge_x > threshold_x)
                    if ((tab_bar->ReorderRequestDir < 0 && tab_bar->GetTabOrder(tab) == 0) || (tab_bar->ReorderRequestDir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                g.ActiveId = g.MovingWindow->MoveId;
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}